

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  size_t *__dest;
  _Any_data *__dest_00;
  __node_base_ptr *pp_Var2;
  Builder *this;
  pointer pcVar3;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar4;
  _Hash_node_base *p_Var5;
  string_view *psVar6;
  _Hash_node_base *p_Var7;
  Expression *left;
  long *plVar8;
  key_type *pkVar9;
  size_t sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  _Hash_node_base *p_Var14;
  _Hash_node_base *p_Var15;
  _Hash_node_base *p_Var16;
  _Hash_node_base *p_Var17;
  _Hash_node_base *p_Var18;
  ulong uVar19;
  __node_base_ptr p_Var20;
  char cVar21;
  byte bVar22;
  uint uVar23;
  string *psVar24;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar25;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar26;
  ostream *poVar27;
  Module *this_00;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var28;
  mapped_type *pmVar29;
  mapped_type *pmVar30;
  undefined8 uVar31;
  long lVar32;
  Call *right;
  Block *pBVar33;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var34;
  const_iterator cVar35;
  mapped_type *pmVar36;
  __hash_code __code;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  Importable *pIVar37;
  Importable *pIVar38;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar39;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr_7;
  ulong *puVar40;
  undefined8 *puVar41;
  key_type *ppEVar42;
  __node_base_ptr __k;
  char *pcVar43;
  char *pcVar44;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  ulong *puVar45;
  undefined8 *puVar46;
  undefined8 *puVar47;
  undefined8 *puVar48;
  pointer __p;
  long lVar49;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr;
  _Hash_node_base *p_Var50;
  bool bVar51;
  Name NVar52;
  undefined1 auVar53 [16];
  string_view sVar54;
  Name NVar55;
  Name NVar56;
  Name NVar57;
  Name NVar58;
  Name NVar59;
  Name NVar60;
  Name NVar61;
  optional<wasm::Type> type;
  undefined1 local_9b8 [8];
  ToolOptions options;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  inputSourceMapFilenames;
  undefined1 *local_7e8;
  undefined8 local_7e0;
  code *local_7d8;
  code *local_7d0;
  undefined1 *local_7c8;
  undefined8 local_7c0;
  code *local_7b8;
  code *local_7b0;
  undefined1 *local_7a8;
  undefined8 local_7a0;
  code *local_798;
  code *local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  code *local_778;
  code *local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  code *local_758;
  code *local_750;
  long *local_748 [2];
  long local_738 [2];
  char local_728;
  long *local_720 [2];
  long local_710 [2];
  char local_700;
  long *local_6f8 [2];
  long local_6e8 [2];
  long *local_6d8 [2];
  long local_6c8 [2];
  long *local_6b8 [2];
  long local_6a8 [2];
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  long *local_638 [2];
  long local_628 [2];
  long *local_618 [2];
  long local_608 [2];
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  long *local_4f8 [2];
  long local_4e8 [2];
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  size_type *local_438;
  string outputSourceMapFilename;
  string outputSourceMapUrl;
  Builder builder;
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  undefined1 auStack_398 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFileNames;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  float local_358;
  undefined4 uStack_354;
  undefined1 uStack_350;
  undefined7 uStack_34f;
  undefined1 auStack_348 [8];
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *puStack_340;
  pointer puStack_338;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_330;
  undefined4 uStack_328;
  undefined4 uStack_324;
  string local_320 [8];
  pointer local_318;
  undefined1 local_310 [8];
  undefined1 local_308;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> *local_300;
  pointer local_2f8;
  pointer local_2f0;
  pointer puStack_2e8;
  undefined4 local_2e0;
  pointer local_2d8;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Stack_2d0;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> *local_2c8;
  pointer local_2c0;
  size_t local_2b8;
  char *pcStack_2b0;
  undefined4 local_2a8;
  pointer local_2a0;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> _Stack_298;
  undefined2 local_290;
  undefined1 auStack_1e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFiles;
  ModuleReader reader;
  size_type *local_1b0;
  string WasmMergeOption;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> laterInput;
  __node_base_ptr local_180 [2];
  Importable *local_170;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_168;
  undefined1 local_140 [8];
  KindNameUpdates kindNameUpdates;
  value_type inputFileName;
  size_type *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> inputSourceMapFilename;
  value_type inputFile;
  undefined1 local_98 [8];
  KindModuleExportMaps kindModuleExportMaps;
  __node_base _Stack_58;
  bool valid;
  code *local_48;
  code *local_40;
  undefined1 local_32;
  undefined1 local_31 [7];
  bool emitBinary;
  bool debugInfo;
  
  auStack_1e8 = (undefined1  [8])0x0;
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_398 = (undefined1  [8])0x0;
  inputFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_32 = 1;
  local_31[0] = 0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&inputSourceMapFilenames;
  inputSourceMapFilenames._M_t._M_impl._0_4_ = 0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_438 = &outputSourceMapFilename._M_string_length;
  outputSourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapFilename._M_string_length._0_1_ = 0;
  outputSourceMapFilename.field_2._8_8_ = &outputSourceMapUrl._M_string_length;
  outputSourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapUrl._M_string_length._0_1_ = 0;
  local_1b0 = &WasmMergeOption._M_string_length;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"wasm-merge options","");
  local_378._0_8_ = local_378 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"wasm-merge","");
  psVar1 = &kindModuleExportMaps._M_h._M_bucket_count;
  local_98 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "Merge wasm files into one.\n\nFor example,\n\n  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm\n\nwill read foo.wasm and bar.wasm, with names \'foo\' and \'bar\' respectively, so if the second imports from \'foo\', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.\n\nNote that filenames and modules names are interleaved (which is hopefully less confusing).\n\nInput source maps can be specified by adding an -ism option right after the module name:\n\n  wasm-merge foo.wasm foo -ism foo.wasm.map ..."
             ,"");
  wasm::ToolOptions::ToolOptions((ToolOptions *)local_9b8,(string *)local_378,(string *)local_98);
  if (local_98 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_98,kindModuleExportMaps._M_h._M_bucket_count + 1);
  }
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
  }
  local_378._0_8_ = local_378 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"--output","");
  local_98 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"-o","");
  local_140 = (undefined1  [8])&kindNameUpdates._M_h._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Output file","");
  _Stack_58._M_nxt = (_Hash_node_base *)0x0;
  _valid = 0;
  local_40 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:596:10)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:596:10)>
             ::_M_manager;
  psVar24 = (string *)
            wasm::Options::add((string *)&options,(string *)local_378,(string *)local_98,
                               (string *)local_140,(Arguments)&local_1b0,(function *)0x1,
                               SUB81(&_Stack_58,0));
  inputSourceMapFilename.field_2._8_8_ = &inputFile._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&inputSourceMapFilename.field_2 + 8),
             "INFILE1 NAME1 INFILE2 NAME2 [..]","");
  inputFileName.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:602:21)>
       ::_M_invoke;
  inputFileName._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:602:21)>
       ::_M_manager;
  kindNameUpdates._M_h._M_single_bucket = (__node_base_ptr)auStack_1e8;
  inputFileName._M_dataplus._M_p = auStack_398;
  psVar24 = (string *)
            wasm::Options::add_positional
                      (psVar24,(int)&inputSourceMapFilename + 0x18,(function *)0x2);
  local_e0 = &inputSourceMapFilename._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"--input-source-map","");
  local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_168.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"-ism","");
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&reader.skipFunctionBodies;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &inputFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "Consume source maps from the specified files","");
  outputSourceMapUrl.field_2._8_8_ = operator_new(0x18);
  *(__node_base_ptr *)outputSourceMapUrl.field_2._8_8_ = (__node_base_ptr)auStack_1e8;
  *(undefined1 **)(outputSourceMapUrl.field_2._8_8_ + 8) = auStack_398;
  *(FeatureSet **)(outputSourceMapUrl.field_2._8_8_ + 0x10) = &options.enabledFeatures;
  psVar24 = (string *)
            wasm::Options::add(psVar24,(string *)&local_e0,(string *)&local_168,
                               (string *)
                               &inputFiles.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (Arguments)&local_1b0,(function *)0x2,
                               (bool)((char)&outputSourceMapUrl + '\x18'));
  WasmMergeOption.field_2._8_8_ = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmMergeOption.field_2 + 8),"--output-source-map","");
  local_618[0] = local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"-osm","");
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5f8,"Emit source map to the specified file","");
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_438;
  psVar24 = (string *)
            wasm::Options::add(psVar24,(string *)(WasmMergeOption.field_2._M_local_buf + 8),
                               (string *)local_618,(string *)local_5f8,(Arguments)&local_1b0,
                               (function *)0x1,(bool)((char)&inputSourceMapFilenames + '('));
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"--output-source-map-url","");
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"-osu","");
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_598,"Emit specified string as source map URL","");
  local_7e0 = 0;
  local_7e8 = (undefined1 *)((long)&outputSourceMapFilename.field_2 + 8);
  local_7d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:637:10)>
              ::_M_invoke;
  local_7d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:637:10)>
              ::_M_manager;
  psVar24 = (string *)
            wasm::Options::add(psVar24,(string *)local_5d8,(string *)local_5b8,(string *)local_598,
                               (Arguments)&local_1b0,(function *)0x1,SUB81(&local_7e8,0));
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_578,"--rename-export-conflicts","");
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"-rec","");
  local_538[0] = local_528;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,"Rename exports to avoid conflicts (rather than error)","");
  local_788 = 0;
  uStack_780 = 0;
  local_770 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:645:10)>
              ::_M_invoke;
  local_778 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:645:10)>
              ::_M_manager;
  psVar24 = (string *)
            wasm::Options::add(psVar24,(string *)local_578,(string *)local_558,(string *)local_538,
                               (Arguments)&local_1b0,(function *)0x0,SUB81(&local_788,0));
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"--skip-export-conflicts","");
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"-sec","");
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d8,"Skip exports that conflict with previous ones","");
  local_768 = 0;
  uStack_760 = 0;
  local_750 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:653:10)>
              ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:653:10)>
              ::_M_manager;
  psVar24 = (string *)
            wasm::Options::add(psVar24,(string *)local_518,(string *)local_4f8,(string *)local_4d8,
                               (Arguments)&local_1b0,(function *)0x0,SUB81(&local_768,0));
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"--emit-text","");
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"-S","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_478,"Emit text instead of binary for the output file","");
  local_7c0 = 0;
  local_7c8 = &local_32;
  local_7b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:661:10)>
              ::_M_invoke;
  local_7b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:661:10)>
              ::_M_manager;
  psVar24 = (string *)
            wasm::Options::add(psVar24,(string *)local_4b8,(string *)local_498,(string *)local_478,
                               (Arguments)&local_1b0,(function *)0x0,SUB81(&local_7c8,0));
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"--debuginfo","");
  local_6f8[0] = local_6e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"-g","");
  local_6d8[0] = local_6c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6d8,"Emit names section and debug info","");
  local_7a0 = 0;
  local_7a8 = local_31;
  local_790 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:667:10)>
              ::_M_invoke;
  local_798 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:667:10)>
              ::_M_manager;
  wasm::Options::add(psVar24,(string *)local_458,(string *)local_6f8,(string *)local_6d8,
                     (Arguments)&local_1b0,(function *)0x0,SUB81(&local_7a8,0));
  if (local_798 != (code *)0x0) {
    (*local_798)(&local_7a8,&local_7a8,3);
  }
  if (local_6d8[0] != local_6c8) {
    operator_delete(local_6d8[0],local_6c8[0] + 1);
  }
  if (local_6f8[0] != local_6e8) {
    operator_delete(local_6f8[0],local_6e8[0] + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_7b8 != (code *)0x0) {
    (*local_7b8)(&local_7c8,&local_7c8,3);
  }
  if (local_478[0] != local_468) {
    operator_delete(local_478[0],local_468[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0],local_4a8[0] + 1);
  }
  if (local_758 != (code *)0x0) {
    (*local_758)(&local_768,&local_768,3);
  }
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],local_4e8[0] + 1);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  if (local_778 != (code *)0x0) {
    (*local_778)(&local_788,&local_788,3);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  if (local_7d8 != (code *)0x0) {
    (*local_7d8)(&local_7e8,&local_7e8,3);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  __dest = &inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:629:10)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  if (local_5f8[0] != local_5e8) {
    operator_delete(local_5f8[0],local_5e8[0] + 1);
  }
  if (local_618[0] != local_608) {
    operator_delete(local_618[0],local_608[0] + 1);
  }
  if ((__node_base_ptr *)WasmMergeOption.field_2._8_8_ != local_180) {
    operator_delete((void *)WasmMergeOption.field_2._8_8_,(ulong)((long)&local_180[0]->_M_nxt + 1));
  }
  __dest_00 = (_Any_data *)((long)&outputSourceMapUrl.field_2 + 8);
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:614:10)>
  ::_M_manager(__dest_00,__dest_00,__destroy_functor);
  if (inputFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&reader.skipFunctionBodies) {
    operator_delete(inputFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,stack0xfffffffffffffe40 + 1);
  }
  if (local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&local_168.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_168.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_e0 != &inputSourceMapFilename._M_string_length) {
    operator_delete(local_e0,inputSourceMapFilename._M_string_length + 1);
  }
  if (inputFileName._M_string_length != 0) {
    pp_Var2 = &kindNameUpdates._M_h._M_single_bucket;
    (*(code *)inputFileName._M_string_length)(pp_Var2,pp_Var2,3);
  }
  if ((size_type *)inputSourceMapFilename.field_2._8_8_ != &inputFile._M_string_length) {
    operator_delete((void *)inputSourceMapFilename.field_2._8_8_,inputFile._M_string_length + 1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,3);
  }
  if (local_140 != (undefined1  [8])&kindNameUpdates._M_h._M_bucket_count) {
    operator_delete((void *)local_140,kindNameUpdates._M_h._M_bucket_count + 1);
  }
  if (local_98 != (undefined1  [8])&kindModuleExportMaps._M_h._M_bucket_count) {
    operator_delete((void *)local_98,kindModuleExportMaps._M_h._M_bucket_count + 1);
  }
  if ((Importable *)local_378._0_8_ != (Importable *)(local_378 + 0x10)) {
    operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
  }
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  if ((long)inputFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_1e8 ==
      (long)inputFileNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_398) {
    pIVar37 = (Importable *)
              inputFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((undefined1  [8])
        inputFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_1e8) {
      local_170 = (Importable *)0x0;
      do {
        pIVar37 = local_170;
        inputSourceMapFilename.field_2._8_8_ = &inputFile._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&inputSourceMapFilename.field_2 + 8),
                   ((_Hash_node_base *)((long)auStack_1e8 + (long)local_170 * 4 * 8))->_M_nxt,
                   (long)&((_Hash_node_base *)((long)auStack_1e8 + (long)local_170 * 4 * 8))->_M_nxt
                          ->_M_nxt +
                   (long)&((_Hash_node_base *)((long)auStack_1e8 + ((long)local_170 * 4 + 1) * 8))->
                          _M_nxt->_M_nxt);
        kindNameUpdates._M_h._M_single_bucket = (__node_base_ptr)&inputFileName._M_string_length;
        pcVar3 = (((pointer)((long)auStack_398 + pIVar37 * 0x20))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&kindNameUpdates._M_h._M_single_bucket,pcVar3,
                   pcVar3 + ((pointer)((long)auStack_398 + pIVar37 * 0x20))->_M_string_length);
        if (inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
LAB_0010b5ec:
          local_e0 = &inputSourceMapFilename._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0);
        }
        else {
          pmVar26 = &inputSourceMapFilenames;
          pmVar4 = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          do {
            pmVar39 = pmVar4;
            pmVar25 = pmVar26;
            pIVar38 = (Importable *)(pmVar39->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right
            ;
            pmVar26 = pmVar39;
            if (pIVar38 < pIVar37) {
              pmVar26 = pmVar25;
            }
            pmVar4 = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(&(pmVar39->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
                        [pIVar38 < pIVar37];
          } while (pmVar4 != (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x0);
          if (pmVar26 == &inputSourceMapFilenames) goto LAB_0010b5ec;
          if (pIVar38 < pIVar37) {
            pmVar39 = pmVar25;
          }
          if (pIVar37 < (Importable *)
                        (pmVar39->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)
          goto LAB_0010b5ec;
          local_e0 = &inputSourceMapFilename._M_string_length;
          sVar10 = (pmVar26->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,sVar10,*(long *)&pmVar26[1]._M_t._M_impl + sVar10);
        }
        if ((char)options._vptr_ToolOptions == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"reading input \'",0xf);
          poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(char *)inputSourceMapFilename.field_2._8_8_,
                               (long)inputFile._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\' as \'",6);
          poVar27 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar27,(char *)kindNameUpdates._M_h._M_single_bucket,
                               (long)inputFileName._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\'...\n",5);
        }
        WasmMergeOption.field_2._8_8_ = 0;
        uVar31 = (__node_base_ptr)&(anonymous_namespace)::merged;
        if ((int)local_170 != 0) {
          this_00 = (Module *)operator_new(0x3f0);
          memset(this_00,0,0x3f0);
          wasm::Module::Module(this_00);
          uVar31 = WasmMergeOption.field_2._8_8_;
          local_378._0_8_ = (Importable *)0x0;
          bVar51 = WasmMergeOption.field_2._8_8_ != 0;
          WasmMergeOption.field_2._8_8_ = this_00;
          if (bVar51) {
            wasm::Module::~Module((Module *)uVar31);
            operator_delete((void *)uVar31,0x3f0);
          }
          std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                    ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)local_378);
          uVar31 = WasmMergeOption.field_2._8_8_;
        }
        uVar23 = *(uint *)&((__node_base_ptr)(uVar31 + 0x178))->_M_nxt | options._368_4_;
        *(uint *)&((__node_base_ptr)(uVar31 + 0x178))->_M_nxt = uVar23;
        *(IRProfile *)&((__node_base_ptr)(uVar31 + 0x178))->_M_nxt = ~options.profile & uVar23;
        uVar19 = (ulong)inputFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x10;
        reader.super_ModuleIOBase.debugInfo = false;
        inputFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT62((uint6)uVar19 & 0xffff,1);
        local_3d8[0] = local_3c8;
        kindModuleExportMaps._M_h._M_single_bucket = (__node_base_ptr)uVar31;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,inputSourceMapFilename.field_2._8_8_,
                   inputFile._M_dataplus._M_p + inputSourceMapFilename.field_2._8_8_);
        local_3b8[0] = local_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3b8,local_e0,
                   inputSourceMapFilename._M_dataplus._M_p + (long)local_e0);
        wasm::ModuleReader::read
                  (&inputFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_3d8,
                   kindModuleExportMaps._M_h._M_single_bucket,(string *)local_3b8);
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        p_Var20 = kindModuleExportMaps._M_h._M_single_bucket;
        if (local_3d8[0] != local_3c8) {
          operator_delete(local_3d8[0],local_3c8[0] + 1);
        }
        if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::clear((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(p_Var20 + 0x39));
        }
        if ((options._177_1_ != '\0') &&
           (cVar21 = wasm::WasmValidator::validate((Module *)local_378,(uint)p_Var20),
           cVar21 == '\0')) {
          poVar27 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)p_Var20);
          local_378[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar27,local_378,1);
          wasm::Fatal::Fatal((Fatal *)local_378);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_378 + 0x10),"error in validating input: ",0x1b);
          wasm::Fatal::operator<<
                    ((Fatal *)local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&inputSourceMapFilename.field_2 + 8));
          goto LAB_0010dd58;
        }
        puVar45 = DAT_00126330;
        puVar40 = (anonymous_namespace)::merged;
        if (WasmMergeOption.field_2._8_8_ == 0) {
          for (; puVar40 != puVar45; puVar40 = puVar40 + 1) {
            __k = kindNameUpdates._M_h._M_single_bucket;
            sVar54 = (string_view)
                     wasm::IString::interned
                               (inputFileName._M_dataplus._M_p,kindNameUpdates._M_h._M_single_bucket
                                ,0);
            local_98 = (undefined1  [8])*puVar40;
            local_378._0_8_ = ((string_view *)&((string_view *)local_98)->_M_len)->_M_len;
            local_378._8_8_ = ((__node_base *)&((string_view *)local_98)->_M_str)->_M_nxt;
            pmVar30 = std::
                      unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                      ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                    *)local_98,(key_type *)__k);
            (pmVar30->moduleName).super_IString.str = sVar54;
            *(undefined4 *)&(pmVar30->baseName).super_IString.str._M_len = local_378._0_4_;
            *(undefined4 *)((long)&(pmVar30->baseName).super_IString.str._M_len + 4) =
                 local_378._4_4_;
            *(undefined4 *)&(pmVar30->baseName).super_IString.str._M_str = local_378._8_4_;
            *(undefined4 *)((long)&(pmVar30->baseName).super_IString.str._M_str + 4) =
                 local_378._12_4_;
          }
        }
        else {
          auVar53 = wasm::IString::interned
                              (inputFileName._M_dataplus._M_p,kindNameUpdates._M_h._M_single_bucket,
                               0);
          local_378._0_8_ = auStack_348;
          local_378._8_8_ = (_Hash_node_base *)0x1;
          local_368._M_allocated_capacity = 0;
          local_368._8_8_ = 0;
          local_358 = 1.0;
          uStack_350 = 0;
          uStack_34f = 0;
          auStack_348[0] = 0;
          auStack_348._1_2_ = 0;
          auStack_348[3] = 0;
          auStack_348._4_4_ = 0;
          p_Var50 = p_Var20[3]._M_nxt;
          p_Var5 = p_Var20[4]._M_nxt;
          while( true ) {
            inputFileName.field_2._8_8_ = auVar53._8_8_;
            inputFile.field_2._8_8_ = auVar53._0_8_;
            if (p_Var50 == p_Var5) break;
            sVar54 = (string_view)
                     wasm::Names::getValidFunctionName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)&p_Var50->_M_nxt->_M_nxt);
            psVar6 = (string_view *)p_Var50->_M_nxt;
            local_98 = (undefined1  [8])((ulong)local_98 & 0xffffffff00000000);
            if (psVar6->_M_str != sVar54._M_str) {
              p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_378,(key_type *)local_98);
              pmVar29 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var28,(key_type *)psVar6);
              (pmVar29->super_IString).str = sVar54;
              *psVar6 = sVar54;
            }
            auVar53._8_8_ = inputFileName.field_2._8_8_;
            auVar53._0_8_ = inputFile.field_2._8_8_;
            p_Var50 = p_Var50 + 1;
          }
          p_Var50 = kindModuleExportMaps._M_h._M_single_bucket[6]._M_nxt;
          p_Var5 = kindModuleExportMaps._M_h._M_single_bucket[7]._M_nxt;
          while( true ) {
            inputFileName.field_2._8_8_ = auVar53._8_8_;
            inputFile.field_2._8_8_ = auVar53._0_8_;
            if (p_Var50 == p_Var5) break;
            sVar54 = (string_view)
                     wasm::Names::getValidGlobalName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)&p_Var50->_M_nxt->_M_nxt);
            psVar6 = (string_view *)p_Var50->_M_nxt;
            local_98._0_4_ = 3;
            if (psVar6->_M_str != sVar54._M_str) {
              p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_378,(key_type *)local_98);
              pmVar29 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var28,(key_type *)psVar6);
              (pmVar29->super_IString).str = sVar54;
              *psVar6 = sVar54;
            }
            auVar53._8_8_ = inputFileName.field_2._8_8_;
            auVar53._0_8_ = inputFile.field_2._8_8_;
            p_Var50 = p_Var50 + 1;
          }
          p_Var50 = kindModuleExportMaps._M_h._M_single_bucket[9]._M_nxt;
          p_Var5 = kindModuleExportMaps._M_h._M_single_bucket[10]._M_nxt;
          while( true ) {
            inputFileName.field_2._8_8_ = auVar53._8_8_;
            inputFile.field_2._8_8_ = auVar53._0_8_;
            if (p_Var50 == p_Var5) break;
            sVar54 = (string_view)
                     wasm::Names::getValidTagName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)&p_Var50->_M_nxt->_M_nxt);
            psVar6 = (string_view *)p_Var50->_M_nxt;
            local_98._0_4_ = 4;
            if (psVar6->_M_str != sVar54._M_str) {
              p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_378,(key_type *)local_98);
              pmVar29 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var28,(key_type *)psVar6);
              (pmVar29->super_IString).str = sVar54;
              *psVar6 = sVar54;
            }
            auVar53._8_8_ = inputFileName.field_2._8_8_;
            auVar53._0_8_ = inputFile.field_2._8_8_;
            p_Var50 = p_Var50 + 1;
          }
          p_Var50 = kindModuleExportMaps._M_h._M_single_bucket[0xc]._M_nxt;
          p_Var5 = kindModuleExportMaps._M_h._M_single_bucket[0xd]._M_nxt;
          while( true ) {
            inputFileName.field_2._8_8_ = auVar53._8_8_;
            inputFile.field_2._8_8_ = auVar53._0_8_;
            if (p_Var50 == p_Var5) break;
            sVar54 = (string_view)
                     wasm::Names::getValidElementSegmentName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)&p_Var50->_M_nxt->_M_nxt);
            psVar6 = (string_view *)p_Var50->_M_nxt;
            local_98._0_4_ = 6;
            if (psVar6->_M_str != sVar54._M_str) {
              p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_378,(key_type *)local_98);
              pmVar29 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var28,(key_type *)psVar6);
              (pmVar29->super_IString).str = sVar54;
              *psVar6 = sVar54;
            }
            auVar53._8_8_ = inputFileName.field_2._8_8_;
            auVar53._0_8_ = inputFile.field_2._8_8_;
            p_Var50 = p_Var50 + 1;
          }
          p_Var50 = kindModuleExportMaps._M_h._M_single_bucket[0xf]._M_nxt;
          p_Var5 = kindModuleExportMaps._M_h._M_single_bucket[0x10]._M_nxt;
          while( true ) {
            inputFileName.field_2._8_8_ = auVar53._8_8_;
            inputFile.field_2._8_8_ = auVar53._0_8_;
            if (p_Var50 == p_Var5) break;
            sVar54 = (string_view)
                     wasm::Names::getValidMemoryName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)&p_Var50->_M_nxt->_M_nxt);
            psVar6 = (string_view *)p_Var50->_M_nxt;
            local_98._0_4_ = 2;
            if (psVar6->_M_str != sVar54._M_str) {
              p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_378,(key_type *)local_98);
              pmVar29 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var28,(key_type *)psVar6);
              (pmVar29->super_IString).str = sVar54;
              *psVar6 = sVar54;
            }
            auVar53._8_8_ = inputFileName.field_2._8_8_;
            auVar53._0_8_ = inputFile.field_2._8_8_;
            p_Var50 = p_Var50 + 1;
          }
          p_Var50 = kindModuleExportMaps._M_h._M_single_bucket[0x12]._M_nxt;
          p_Var5 = kindModuleExportMaps._M_h._M_single_bucket[0x13]._M_nxt;
          while( true ) {
            inputFileName.field_2._8_8_ = auVar53._8_8_;
            inputFile.field_2._8_8_ = auVar53._0_8_;
            if (p_Var50 == p_Var5) break;
            sVar54 = (string_view)
                     wasm::Names::getValidDataSegmentName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)&p_Var50->_M_nxt->_M_nxt);
            psVar6 = (string_view *)p_Var50->_M_nxt;
            local_98._0_4_ = 5;
            if (psVar6->_M_str != sVar54._M_str) {
              p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_378,(key_type *)local_98);
              pmVar29 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var28,(key_type *)psVar6);
              (pmVar29->super_IString).str = sVar54;
              *psVar6 = sVar54;
            }
            auVar53._8_8_ = inputFileName.field_2._8_8_;
            auVar53._0_8_ = inputFile.field_2._8_8_;
            p_Var50 = p_Var50 + 1;
          }
          p_Var50 = kindModuleExportMaps._M_h._M_single_bucket[0x15]._M_nxt;
          p_Var5 = kindModuleExportMaps._M_h._M_single_bucket[0x16]._M_nxt;
          while( true ) {
            p_Var20 = kindModuleExportMaps._M_h._M_single_bucket;
            inputFileName.field_2._8_8_ = auVar53._8_8_;
            inputFile.field_2._8_8_ = auVar53._0_8_;
            if (p_Var50 == p_Var5) break;
            sVar54 = (string_view)
                     wasm::Names::getValidTableName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)&p_Var50->_M_nxt->_M_nxt);
            psVar6 = (string_view *)p_Var50->_M_nxt;
            local_98._0_4_ = 1;
            if (psVar6->_M_str != sVar54._M_str) {
              p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_378,(key_type *)local_98);
              pmVar29 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var28,(key_type *)psVar6);
              (pmVar29->super_IString).str = sVar54;
              *psVar6 = sVar54;
            }
            auVar53._8_8_ = inputFileName.field_2._8_8_;
            auVar53._0_8_ = inputFile.field_2._8_8_;
            p_Var50 = p_Var50 + 1;
          }
          anon_unknown.dwarf_3e556::updateNames
                    ((Module *)kindModuleExportMaps._M_h._M_single_bucket,
                     (KindNameUpdates *)local_378);
          std::
          _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_378);
          ppEVar42 = (key_type *)&(anonymous_namespace)::merged;
          wasm::ModuleUtils::copyModuleItems
                    ((Module *)p_Var20,(Module *)&(anonymous_namespace)::merged);
          p_Var5 = p_Var20[1]._M_nxt;
          for (p_Var50 = p_Var20->_M_nxt; p_Var50 != p_Var5; p_Var50 = p_Var50 + 1) {
            p_Var7 = p_Var50->_M_nxt;
            local_140 = (undefined1  [8])operator_new(0x30);
            p_Var14 = p_Var7->_M_nxt;
            p_Var15 = p_Var7[1]._M_nxt;
            p_Var16 = p_Var7[2]._M_nxt;
            p_Var17 = p_Var7[3]._M_nxt;
            p_Var18 = p_Var7[5]._M_nxt;
            ((string_view *)((long)local_140 + 0x20))->_M_len = (size_t)p_Var7[4]._M_nxt;
            ((string_view *)((long)local_140 + 0x20))->_M_str = (char *)p_Var18;
            ((string_view *)((long)local_140 + 0x10))->_M_len = (size_t)p_Var16;
            ((string_view *)((long)local_140 + 0x10))->_M_str = (char *)p_Var17;
            ((string_view *)local_140)->_M_len = (size_t)p_Var14;
            ((string_view *)local_140)->_M_str = (char *)p_Var15;
            local_378._0_8_ = p_Var7->_M_nxt;
            local_378._8_8_ = p_Var7[1]._M_nxt;
            local_98 = local_140;
            pmVar30 = std::
                      unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                      ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                    *)local_140,ppEVar42);
            (pmVar30->moduleName).super_IString.str._M_len = inputFile.field_2._8_8_;
            (pmVar30->moduleName).super_IString.str._M_str = (char *)inputFileName.field_2._8_8_;
            (pmVar30->baseName).super_IString.str._M_len = local_378._0_8_;
            (pmVar30->baseName).super_IString.str._M_str = (char *)local_378._8_8_;
            uVar31 = inputFileName.field_2._8_8_;
            sVar54 = (string_view)
                     wasm::Names::getValidExportName
                               ((Module *)&(anonymous_namespace)::merged,
                                (Name)*(string_view *)local_98);
            *(string_view *)local_98 = sVar54;
            if ((_Hash_node_base *)sVar54._M_str == p_Var50->_M_nxt[1]._M_nxt) {
LAB_0010bcbb:
              ppEVar42 = (key_type *)local_98;
              wasm::Module::addExport((unique_ptr *)&(anonymous_namespace)::merged);
              if (local_98 != (undefined1  [8])0x0) goto LAB_0010bcda;
            }
            else {
              if ((anonymous_namespace)::exportMergeMode != 2) {
                if ((anonymous_namespace)::exportMergeMode != 0) goto LAB_0010bcbb;
                wasm::Fatal::Fatal((Fatal *)local_378);
                poVar27 = (ostream *)(local_378 + 0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar27,"Export name conflict: ",0x16);
                NVar52.super_IString.str._M_str = (char *)uVar31;
                NVar52.super_IString.str._M_len = (size_t)p_Var50->_M_nxt[1]._M_nxt;
                wasm::operator<<((wasm *)poVar27,(ostream *)p_Var50->_M_nxt->_M_nxt,NVar52);
                std::__ostream_insert<char,std::char_traits<char>>(poVar27," (consider",10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar27," --rename-export-conflicts or",0x1d);
                wasm::Fatal::operator<<
                          ((Fatal *)local_378,(char (*) [27])" --skip-export-conflicts)\n");
                goto LAB_0010dd58;
              }
LAB_0010bcda:
              ppEVar42 = (key_type *)0x30;
              operator_delete((void *)local_98,0x30);
            }
          }
          if (p_Var20[0x19]._M_nxt != (_Hash_node_base *)0x0) {
            if (DAT_001263f0 == (_Hash_node_base *)0x0) {
              _DAT_001263e8 = p_Var20[0x18]._M_nxt;
              DAT_001263f0 = p_Var20[0x19]._M_nxt;
            }
            else {
              NVar52.super_IString.str = (IString)wasm::IString::interned(0x10,"merged.start.old",0)
              ;
              NVar52 = wasm::Names::getValidFunctionName
                                 ((Module *)&(anonymous_namespace)::merged,NVar52);
              inputFileName.field_2._8_8_ = NVar52.super_IString.str._M_str;
              inputFile.field_2._8_8_ = NVar52.super_IString.str._M_len;
              NVar52.super_IString.str = (IString)wasm::IString::interned(0x10,"merged.start.new",0)
              ;
              NVar52 = wasm::Names::getValidFunctionName
                                 ((Module *)&(anonymous_namespace)::merged,NVar52);
              NVar55.super_IString.str._M_str = (char *)_DAT_001263e8;
              NVar55.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
              uVar31 = wasm::Module::getFunction(NVar55);
              local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
              kindModuleExportMaps._M_h._M_before_begin._M_nxt =
                   kindModuleExportMaps._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
              lVar32 = wasm::ModuleUtils::copyFunction
                                 (uVar31,&(anonymous_namespace)::merged,inputFile.field_2._8_8_,
                                  inputFileName.field_2._8_8_,local_378,local_98);
              if (((char)kindModuleExportMaps._M_h._M_before_begin._M_nxt == '\x01') &&
                 (kindModuleExportMaps._M_h._M_before_begin._M_nxt =
                       kindModuleExportMaps._M_h._M_before_begin._M_nxt & 0xffffffffffffff00,
                 local_98 != (undefined1  [8])0x0)) {
                operator_delete((void *)local_98,
                                kindModuleExportMaps._M_h._M_bucket_count - (long)local_98);
              }
              if ((local_368._M_local_buf[8] == '\x01') &&
                 (local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00,
                 (Importable *)local_378._0_8_ != (Importable *)0x0)) {
                operator_delete((void *)local_378._0_8_,
                                local_368._M_allocated_capacity - local_378._0_8_);
              }
              NVar56.super_IString.str._M_str = (char *)p_Var20[0x18]._M_nxt;
              NVar56.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
              uVar31 = wasm::Module::getFunction(NVar56);
              kindNameUpdates._M_h._M_before_begin._M_nxt =
                   kindNameUpdates._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
              local_40 = (code *)((ulong)local_40 & 0xffffffffffffff00);
              wasm::ModuleUtils::copyFunction
                        (uVar31,&(anonymous_namespace)::merged,NVar52.super_IString.str._M_len,
                         NVar52.super_IString.str._M_str);
              if (((char)local_40 == '\x01') &&
                 (local_40 = (code *)((ulong)local_40 & 0xffffffffffffff00),
                 _Stack_58._M_nxt != (_Hash_node_base *)0x0)) {
                operator_delete(_Stack_58._M_nxt,(long)local_48 - (long)_Stack_58._M_nxt);
              }
              if (((char)kindNameUpdates._M_h._M_before_begin._M_nxt == '\x01') &&
                 (kindNameUpdates._M_h._M_before_begin._M_nxt =
                       kindNameUpdates._M_h._M_before_begin._M_nxt & 0xffffffffffffff00,
                 local_140 != (undefined1  [8])0x0)) {
                operator_delete((void *)local_140,
                                kindNameUpdates._M_h._M_bucket_count - (long)local_140);
              }
              this = (Builder *)((long)&outputSourceMapUrl.field_2 + 8);
              outputSourceMapUrl.field_2._8_8_ = &(anonymous_namespace)::merged;
              left = *(Expression **)(lVar32 + 0x60);
              local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              args = &local_168;
              right = wasm::Builder::makeCall(this,NVar52,args,(Type)0x0,false);
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args
              ;
              pBVar33 = wasm::Builder::makeSequence(this,left,(Expression *)right,type);
              *(Block **)(lVar32 + 0x60) = pBVar33;
              if (local_168.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              _DAT_001263e8 = (_Hash_node_base *)inputFile.field_2._8_8_;
              DAT_001263f0 = (_Hash_node_base *)inputFileName.field_2._8_8_;
            }
          }
          if ((options._177_1_ == '\x01') &&
             (cVar21 = wasm::WasmValidator::validate((Module *)local_378,0x126328), cVar21 == '\0'))
          {
            poVar27 = (ostream *)
                      std::operator<<((ostream *)&std::cout,(Module *)&(anonymous_namespace)::merged
                                     );
            local_378[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,local_378,1);
            wasm::Fatal::Fatal((Fatal *)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_378 + 0x10),"error in validating merged after: ",0x22);
            wasm::Fatal::operator<<
                      ((Fatal *)local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&inputSourceMapFilename.field_2 + 8));
            goto LAB_0010dd58;
          }
        }
        std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                  ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
                   ((long)&WasmMergeOption.field_2 + 8));
        if (local_e0 != &inputSourceMapFilename._M_string_length) {
          operator_delete(local_e0,inputSourceMapFilename._M_string_length + 1);
        }
        if (kindNameUpdates._M_h._M_single_bucket !=
            (__node_base_ptr)&inputFileName._M_string_length) {
          operator_delete(kindNameUpdates._M_h._M_single_bucket,inputFileName._M_string_length + 1);
        }
        if ((size_type *)inputSourceMapFilename.field_2._8_8_ != &inputFile._M_string_length) {
          operator_delete((void *)inputSourceMapFilename.field_2._8_8_,
                          inputFile._M_string_length + 1);
        }
        local_170 = (Importable *)(ulong)((int)local_170 + 1);
        pIVar37 = (Importable *)
                  ((long)inputFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_1e8 >> 5);
      } while (local_170 < pIVar37);
    }
    puVar40 = DAT_00126330;
    local_98 = (undefined1  [8])&kindModuleExportMaps._M_h._M_rehash_policy._M_next_resize;
    kindModuleExportMaps._M_h._M_buckets = (__buckets_ptr)0x1;
    kindModuleExportMaps._M_h._M_bucket_count = 0;
    kindModuleExportMaps._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    kindModuleExportMaps._M_h._M_element_count._0_4_ = 0x3f800000;
    kindModuleExportMaps._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    kindModuleExportMaps._M_h._M_rehash_policy._4_4_ = 0;
    kindModuleExportMaps._M_h._M_rehash_policy._M_next_resize = 0;
    puVar46 = DAT_00126340;
    puVar48 = DAT_00126348;
    for (puVar45 = (anonymous_namespace)::merged; DAT_00126340 = puVar46, DAT_00126348 = puVar48,
        puVar45 != puVar40; puVar45 = puVar45 + 1) {
      pIVar37 = (Importable *)*puVar45;
      if ((char)(pIVar37->base).super_IString.str._M_len == '\0') {
        ppEVar42 = (key_type *)((ulong)pIVar37 % DAT_00126720);
        plVar8 = *(long **)((anonymous_namespace)::exportModuleMap + (long)ppEVar42 * 8);
        if (plVar8 == (long *)0x0) {
LAB_0010d2ed:
          __assert_fail("exportModuleMap.count(ex.get())",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp"
                        ,0x1c0,"void (anonymous namespace)::fuseImportsAndExports()");
        }
        plVar8 = (long *)*plVar8;
        pIVar38 = (Importable *)plVar8[1];
        while (pIVar38 != pIVar37) {
          plVar8 = (long *)*plVar8;
          if ((plVar8 == (long *)0x0) ||
             (pIVar38 = (Importable *)plVar8[1],
             (key_type *)((ulong)pIVar38 % DAT_00126720) != ppEVar42)) goto LAB_0010d2ed;
        }
        pIVar38 = pIVar37;
        local_378._0_8_ = pIVar37;
        pmVar30 = std::
                  unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                  ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                *)local_378,ppEVar42);
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)(*puVar45 + 0x10));
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,&pmVar30->moduleName);
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,&pmVar30->baseName);
        uVar11 = *(undefined4 *)((long)&(pIVar37->module).super_IString.str._M_len + 4);
        uVar12 = *(undefined4 *)&(pIVar37->module).super_IString.str._M_str;
        uVar13 = *(undefined4 *)((long)&(pIVar37->module).super_IString.str._M_str + 4);
        *(int *)&(pmVar29->super_IString).str._M_len =
             (int)(pIVar37->module).super_IString.str._M_len;
        *(undefined4 *)((long)&(pmVar29->super_IString).str._M_len + 4) = uVar11;
        *(undefined4 *)&(pmVar29->super_IString).str._M_str = uVar12;
        *(undefined4 *)((long)&(pmVar29->super_IString).str._M_str + 4) = uVar13;
        pIVar37 = pIVar38;
      }
      puVar46 = DAT_00126340;
      puVar48 = DAT_00126348;
    }
    local_140 = (undefined1  [8])&kindNameUpdates._M_h._M_rehash_policy._M_next_resize;
    kindNameUpdates._M_h._M_buckets = (__buckets_ptr)0x1;
    kindNameUpdates._M_h._M_bucket_count = 0;
    kindNameUpdates._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    kindNameUpdates._M_h._M_element_count._0_4_ = 0x3f800000;
    kindNameUpdates._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    kindNameUpdates._M_h._M_rehash_policy._4_4_ = 0;
    kindNameUpdates._M_h._M_rehash_policy._M_next_resize = 0;
    for (; puVar47 = DAT_001263d8, puVar41 = DAT_001263d0, puVar46 != puVar48; puVar46 = puVar46 + 1
        ) {
      pkVar9 = (key_type *)*puVar46;
      if (pkVar9[2].super_IString.str._M_len != 0) {
        local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)local_378);
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,(key_type *)&pkVar9[1].super_IString.str._M_str);
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,(key_type *)&pkVar9[2].super_IString.str._M_str);
        pcVar44 = (pmVar29->super_IString).str._M_str;
        if (pcVar44 != (char *)0x0) {
          sVar10 = (pmVar29->super_IString).str._M_len;
          _Stack_58._M_nxt._0_4_ = local_378._0_4_;
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,(key_type *)&_Stack_58);
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,pkVar9);
          (pmVar29->super_IString).str._M_len = sVar10;
          (pmVar29->super_IString).str._M_str = pcVar44;
        }
      }
    }
    for (; puVar46 = DAT_001263a8, puVar48 = DAT_001263a0, puVar41 != puVar47; puVar41 = puVar41 + 1
        ) {
      pkVar9 = (key_type *)*puVar41;
      if (pkVar9[2].super_IString.str._M_len != 0) {
        local_378._0_4_ = 1;
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)local_378);
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,(key_type *)&pkVar9[1].super_IString.str._M_str);
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,(key_type *)&pkVar9[2].super_IString.str._M_str);
        pcVar44 = (pmVar29->super_IString).str._M_str;
        if (pcVar44 != (char *)0x0) {
          sVar10 = (pmVar29->super_IString).str._M_len;
          _Stack_58._M_nxt._0_4_ = local_378._0_4_;
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,(key_type *)&_Stack_58);
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,pkVar9);
          (pmVar29->super_IString).str._M_len = sVar10;
          (pmVar29->super_IString).str._M_str = pcVar44;
        }
      }
    }
    for (; puVar47 = DAT_00126360, puVar41 = DAT_00126358, puVar48 != puVar46; puVar48 = puVar48 + 1
        ) {
      pkVar9 = (key_type *)*puVar48;
      if (pkVar9[2].super_IString.str._M_len != 0) {
        local_378._0_4_ = 2;
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)local_378);
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,(key_type *)&pkVar9[1].super_IString.str._M_str);
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,(key_type *)&pkVar9[2].super_IString.str._M_str);
        pcVar44 = (pmVar29->super_IString).str._M_str;
        if (pcVar44 != (char *)0x0) {
          sVar10 = (pmVar29->super_IString).str._M_len;
          _Stack_58._M_nxt._0_4_ = local_378._0_4_;
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,(key_type *)&_Stack_58);
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,pkVar9);
          (pmVar29->super_IString).str._M_len = sVar10;
          (pmVar29->super_IString).str._M_str = pcVar44;
        }
      }
    }
    for (; puVar46 = DAT_00126378, puVar48 = DAT_00126370, puVar41 != puVar47; puVar41 = puVar41 + 1
        ) {
      pkVar9 = (key_type *)*puVar41;
      if (pkVar9[2].super_IString.str._M_len != 0) {
        local_378._0_4_ = 3;
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)local_378);
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,(key_type *)&pkVar9[1].super_IString.str._M_str);
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,(key_type *)&pkVar9[2].super_IString.str._M_str);
        pcVar44 = (pmVar29->super_IString).str._M_str;
        if (pcVar44 != (char *)0x0) {
          sVar10 = (pmVar29->super_IString).str._M_len;
          _Stack_58._M_nxt._0_4_ = local_378._0_4_;
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,(key_type *)&_Stack_58);
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,pkVar9);
          (pmVar29->super_IString).str._M_len = sVar10;
          (pmVar29->super_IString).str._M_str = pcVar44;
        }
      }
    }
    for (; puVar47 = DAT_00126348, puVar48 != puVar46; puVar48 = puVar48 + 1) {
      pkVar9 = (key_type *)*puVar48;
      if (pkVar9[2].super_IString.str._M_len != 0) {
        local_378._0_4_ = 4;
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)local_378);
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,(key_type *)&pkVar9[1].super_IString.str._M_str);
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,(key_type *)&pkVar9[2].super_IString.str._M_str);
        pcVar44 = (pmVar29->super_IString).str._M_str;
        if (pcVar44 != (char *)0x0) {
          sVar10 = (pmVar29->super_IString).str._M_len;
          _Stack_58._M_nxt._0_4_ = local_378._0_4_;
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,(key_type *)&_Stack_58);
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,pkVar9);
          (pmVar29->super_IString).str._M_len = sVar10;
          (pmVar29->super_IString).str._M_str = pcVar44;
        }
      }
    }
    _Stack_58._M_nxt._0_1_ = (anon_unknown_dwarf_3e556)0x1;
    if (DAT_00126340 != DAT_00126348) {
      puVar46 = DAT_00126340;
      do {
        pcVar44 = (char *)*puVar46;
        if (*(long *)(pcVar44 + 0x20) != 0) {
          local_378._0_8_ = local_378._0_8_ & 0xffffffff00000000;
          p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_98,(key_type *)local_378);
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](p_Var34,(key_type *)(pcVar44 + 0x18));
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,(key_type *)(pcVar44 + 0x28));
          if ((pmVar29->super_IString).str._M_str != (char *)0x0) {
            NVar57.super_IString.str._M_str = (char *)(pmVar29->super_IString).str._M_len;
            NVar57.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
            lVar32 = wasm::Module::getFunction(NVar57);
            cVar21 = wasm::HeapType::isSubType
                               ((HeapType)*(uintptr_t *)(lVar32 + 0x38),
                                (HeapType)*(uintptr_t *)(pcVar44 + 0x38));
            if (cVar21 == '\0') {
              anon_unknown.dwarf_3e556::reportTypeMismatch
                        ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"function",pcVar44,pIVar37);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"type ",5);
              poVar27 = (ostream *)
                        wasm::operator<<((ostream *)&std::cerr,
                                         (HeapType)*(uintptr_t *)(lVar32 + 0x38));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar27," is not a subtype of ",0x15);
              poVar27 = (ostream *)
                        wasm::operator<<(poVar27,(HeapType)*(uintptr_t *)(pcVar44 + 0x38));
              std::__ostream_insert<char,std::char_traits<char>>(poVar27,".\n",2);
            }
          }
        }
        puVar46 = puVar46 + 1;
      } while (puVar46 != puVar47);
    }
    puVar48 = DAT_001263a0;
    puVar46 = DAT_001263a8;
    if (DAT_001263d0 != DAT_001263d8) {
      inputFile.field_2._8_8_ = DAT_001263d8;
      puVar47 = DAT_001263d0;
      uVar31 = DAT_001263d8;
      do {
        pcVar44 = (char *)*puVar47;
        if (*(long *)(pcVar44 + 0x20) != 0) {
          local_378._0_4_ = 1;
          p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_98,(key_type *)local_378);
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](p_Var34,(key_type *)(pcVar44 + 0x18));
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,(key_type *)(pcVar44 + 0x28));
          if ((pmVar29->super_IString).str._M_str != (char *)0x0) {
            NVar58.super_IString.str._M_str = (char *)(pmVar29->super_IString).str._M_len;
            NVar58.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
            lVar32 = wasm::Module::getTable(NVar58);
            if (*(ulong *)(lVar32 + 0x38) < *(ulong *)(pcVar44 + 0x38)) {
              anon_unknown.dwarf_3e556::reportTypeMismatch
                        ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"table",pcVar44,pIVar37);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"minimal size ",0xd);
              poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar27," is smaller than expected minimal size ",0x27);
              poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
              std::__ostream_insert<char,std::char_traits<char>>(poVar27,".\n",2);
            }
            pIVar37 = (Importable *)0xffffffff;
            if (*(Importable **)(pcVar44 + 0x40) != (Importable *)0xffffffff) {
              pIVar37 = *(Importable **)(lVar32 + 0x40);
              if (pIVar37 == (Importable *)0xffffffff) {
                anon_unknown.dwarf_3e556::reportTypeMismatch
                          ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"table",pcVar44,
                           (Importable *)0xffffffff);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"expecting a bounded ",0x14);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"table",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," but the imported ",0x12);
                lVar49 = 0xf;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"table",5);
                poVar27 = (ostream *)&std::cerr;
                pcVar43 = " is unbounded.\n";
                uVar31 = inputFile.field_2._8_8_;
              }
              else {
                if (pIVar37 <= *(Importable **)(pcVar44 + 0x40)) goto LAB_0010c7f4;
                anon_unknown.dwarf_3e556::reportTypeMismatch
                          ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"table",pcVar44,pIVar37);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"maximal size ",0xd);
                poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar27," is larger than expected maximal size ",0x26);
                poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
                lVar49 = 2;
                pcVar43 = ".\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar27,pcVar43,lVar49);
            }
LAB_0010c7f4:
            if (*(long *)(lVar32 + 0x50) != *(long *)(pcVar44 + 0x50)) {
              anon_unknown.dwarf_3e556::reportTypeMismatch
                        ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"table",pcVar44,pIVar37);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"export type ",0xc);
              poVar27 = (ostream *)
                        wasm::operator<<((ostream *)&std::cerr,(Type)*(uintptr_t *)(lVar32 + 0x50));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar27," is different from import type ",0x1f);
              poVar27 = (ostream *)wasm::operator<<(poVar27,(Type)*(uintptr_t *)(pcVar44 + 0x50));
              std::__ostream_insert<char,std::char_traits<char>>(poVar27,".\n",2);
            }
          }
        }
        puVar47 = puVar47 + 1;
        puVar48 = DAT_001263a0;
        puVar46 = DAT_001263a8;
      } while (puVar47 != (undefined8 *)uVar31);
    }
    for (; puVar47 = DAT_00126360, puVar41 = DAT_00126358, puVar48 != puVar46; puVar48 = puVar48 + 1
        ) {
      pcVar44 = (char *)*puVar48;
      if (*(long *)(pcVar44 + 0x20) != 0) {
        local_378._0_4_ = 2;
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)local_378);
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,(key_type *)(pcVar44 + 0x18));
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,(key_type *)(pcVar44 + 0x28));
        if ((pmVar29->super_IString).str._M_str != (char *)0x0) {
          NVar59.super_IString.str._M_str = (char *)(pmVar29->super_IString).str._M_len;
          NVar59.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar32 = wasm::Module::getMemory(NVar59);
          pIVar37 = (Importable *)
                    CONCAT71((int7)((ulong)pIVar37 >> 8),*(long *)(pcVar44 + 0x50) == 3);
          if ((*(long *)(lVar32 + 0x50) == 3) != (*(long *)(pcVar44 + 0x50) == 3)) {
            anon_unknown.dwarf_3e556::reportTypeMismatch
                      ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)0x11d08d,pcVar44,pIVar37);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"index type should match.\n",0x19);
          }
          if (*(ulong *)(lVar32 + 0x38) < *(ulong *)(pcVar44 + 0x38)) {
            anon_unknown.dwarf_3e556::reportTypeMismatch
                      ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)0x11d08d,pcVar44,pIVar37);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"minimal size ",0xd);
            poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar27," is smaller than expected minimal size ",0x27);
            poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,".\n",2);
          }
          if (*(Importable **)(pcVar44 + 0x40) != (Importable *)0xffffffffffffffff) {
            pIVar37 = *(Importable **)(lVar32 + 0x40);
            if (pIVar37 == (Importable *)0xffffffffffffffff) {
              anon_unknown.dwarf_3e556::reportTypeMismatch
                        ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)0x11d08d,pcVar44,
                         (Importable *)0xffffffffffffffff);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"expecting a bounded ",0x14);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"memory",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," but the imported ",0x12);
              lVar32 = 0xf;
              poVar27 = (ostream *)&std::cerr;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"memory",6);
              pcVar44 = " is unbounded.\n";
            }
            else {
              if (pIVar37 <= *(Importable **)(pcVar44 + 0x40)) goto LAB_0010cad2;
              anon_unknown.dwarf_3e556::reportTypeMismatch
                        ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)0x11d08d,pcVar44,pIVar37);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"maximal size ",0xd);
              poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar27," is larger than expected maximal size ",0x26);
              poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
              lVar32 = 2;
              pcVar44 = ".\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,pcVar44,lVar32);
          }
        }
      }
LAB_0010cad2:
    }
    for (; puVar46 = DAT_00126378, puVar41 != puVar47; puVar41 = puVar41 + 1) {
      pcVar44 = (char *)*puVar41;
      if (*(long *)(pcVar44 + 0x20) != 0) {
        local_378._0_4_ = 3;
        p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_98,(key_type *)local_378);
        p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var34,(key_type *)(pcVar44 + 0x18));
        pmVar29 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var28,(key_type *)(pcVar44 + 0x28));
        if ((pmVar29->super_IString).str._M_str != (char *)0x0) {
          NVar60.super_IString.str._M_str = (char *)(pmVar29->super_IString).str._M_len;
          NVar60.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar32 = wasm::Module::getGlobal(NVar60);
          bVar22 = *(byte *)(lVar32 + 0x48);
          if (bVar22 != pcVar44[0x48]) {
            anon_unknown.dwarf_3e556::reportTypeMismatch
                      ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"global",pcVar44,pIVar37);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"mutability should match.\n",0x19);
            bVar22 = *(byte *)(lVar32 + 0x48);
          }
          if (((bVar22 & 1) != 0) &&
             (pIVar37 = *(Importable **)(lVar32 + 0x38), pIVar37 != *(Importable **)(pcVar44 + 0x38)
             )) {
            anon_unknown.dwarf_3e556::reportTypeMismatch
                      ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"global",pcVar44,pIVar37);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"export type ",0xc);
            poVar27 = (ostream *)
                      wasm::operator<<((ostream *)&std::cerr,(Type)*(uintptr_t *)(lVar32 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar27," is different from import type ",0x1f);
            poVar27 = (ostream *)wasm::operator<<(poVar27,(Type)*(uintptr_t *)(pcVar44 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,".\n",2);
            bVar22 = *(byte *)(lVar32 + 0x48);
          }
          if (((bVar22 & 1) == 0) &&
             (cVar21 = wasm::Type::isSubType
                                 ((Type)*(uintptr_t *)(lVar32 + 0x38),
                                  (Type)*(uintptr_t *)(pcVar44 + 0x38)), cVar21 == '\0')) {
            anon_unknown.dwarf_3e556::reportTypeMismatch
                      ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"global",pcVar44,pIVar37);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"type ",5);
            poVar27 = (ostream *)
                      wasm::operator<<((ostream *)&std::cerr,(Type)*(uintptr_t *)(lVar32 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar27," is not a subtype of ",0x15)
            ;
            poVar27 = (ostream *)wasm::operator<<(poVar27,(Type)*(uintptr_t *)(pcVar44 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,".\n",2);
          }
        }
      }
    }
    if (DAT_00126370 != DAT_00126378) {
      puVar48 = DAT_00126370;
      do {
        pcVar44 = (char *)*puVar48;
        if (*(long *)(pcVar44 + 0x20) != 0) {
          local_378._0_4_ = 4;
          p_Var34 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_98,(key_type *)local_378);
          p_Var28 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](p_Var34,(key_type *)(pcVar44 + 0x18));
          pmVar29 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var28,(key_type *)(pcVar44 + 0x28));
          if (((pmVar29->super_IString).str._M_str != (char *)0x0) &&
             (NVar61.super_IString.str._M_str = (char *)(pmVar29->super_IString).str._M_len,
             NVar61.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged,
             lVar32 = wasm::Module::getTag(NVar61),
             *(long *)(lVar32 + 0x38) != *(long *)(pcVar44 + 0x38))) {
            anon_unknown.dwarf_3e556::reportTypeMismatch
                      ((anon_unknown_dwarf_3e556 *)&_Stack_58,(bool *)"tag",pcVar44,pIVar37);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"export type ",0xc);
            poVar27 = (ostream *)
                      wasm::operator<<((ostream *)&std::cerr,(HeapType)*(uintptr_t *)(lVar32 + 0x38)
                                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar27," is different from import type ",0x1f);
            poVar27 = (ostream *)wasm::operator<<(poVar27,(HeapType)*(uintptr_t *)(pcVar44 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar27,".\n",2);
          }
        }
        puVar48 = puVar48 + 1;
      } while (puVar48 != puVar46);
    }
    if (_Stack_58._M_nxt._0_1_ != (anon_unknown_dwarf_3e556)0x0) {
      anon_unknown.dwarf_3e556::updateNames
                ((Module *)&(anonymous_namespace)::merged,(KindNameUpdates *)local_140);
      std::
      _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_140);
      std::
      _Hashtable<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_98);
      local_300 = &_Stack_2d0;
      local_378._0_8_ = std::_Rb_tree_increment;
      local_378._8_8_ = &(anonymous_namespace)::merged;
      local_368._M_allocated_capacity = (size_type)&DAT_00126528;
      local_368._8_8_ = (undefined1 *)0x0;
      local_358 = 0.0;
      uStack_354 = 0;
      uStack_350 = 0;
      uStack_34f = 0;
      auStack_348[0] = 0;
      auStack_348._1_2_ = 0x101;
      auStack_348._4_4_ = 0;
      puStack_340 = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)0x200000000;
      puStack_338 = (pointer)0x14ffffffff;
      local_330._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._0_4_ =
           (uint)local_330._M_t.
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl & 0xffffff00;
      local_310[0] = 0;
      local_308 = 0;
      local_330._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._4_4_ = 0;
      uStack_328 = 0;
      uStack_324 = 0;
      local_320[0] = (string)0x0;
      local_2f8 = (pointer)0x1;
      local_2f0 = (pointer)0x0;
      puStack_2e8 = (pointer)0x0;
      local_2e0 = 0x3f800000;
      local_2d8 = (pointer)0x0;
      _Stack_2d0._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
           (_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)0x0;
      local_2c8 = &_Stack_298;
      local_2c0 = (pointer)0x1;
      local_2b8 = 0;
      pcStack_2b0 = (char *)0x0;
      local_2a8 = 0x3f800000;
      local_2a0 = (pointer)0x0;
      _Stack_298._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
           (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
           (_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>)0x0;
      local_290 = 0;
      local_6b8[0] = local_6a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"reorder-globals-always","");
      local_728 = '\0';
      wasm::PassRunner::add(local_378,local_6b8,local_748);
      if ((local_728 == '\x01') && (local_728 = '\0', local_748[0] != local_738)) {
        operator_delete(local_748[0],local_738[0] + 1);
      }
      if (local_6b8[0] != local_6a8) {
        operator_delete(local_6b8[0],local_6a8[0] + 1);
      }
      local_698[0] = local_688;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_698,"remove-unused-module-elements","");
      local_700 = '\0';
      wasm::PassRunner::add(local_378,local_698,local_720);
      if ((local_700 == '\x01') && (local_700 = '\0', local_720[0] != local_710)) {
        operator_delete(local_720[0],local_710[0] + 1);
      }
      if (local_698[0] != local_688) {
        operator_delete(local_698[0],local_688[0] + 1);
      }
      wasm::PassRunner::run();
      wasm::PassRunner::~PassRunner((PassRunner *)local_378);
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"output","");
      cVar35 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&options.super_Options,(key_type *)local_378);
      if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
        operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
      }
      if (cVar35._M_node != (_Base_ptr)&options.field_0x10) {
        local_378._8_8_ = &options.field_0xb0;
        local_358 = 0.0;
        uStack_354 = 0;
        uStack_350 = 0;
        puStack_338 = (pointer)0x0;
        local_330._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._0_4_ =
             (uint)local_330._M_t.
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl & 0xffffff00;
        local_320[0] = SUB81(local_310,0);
        local_320._1_7_ = (undefined7)((ulong)local_310 >> 8);
        local_318 = (pointer)0x0;
        local_310[0] = 0;
        local_368._M_allocated_capacity =
             CONCAT71((int7)((ulong)local_368._0_8_ >> 8),local_32) & 0xffffffffffff00ff;
        local_378[0] = local_31[0];
        local_368._8_8_ = &uStack_350;
        puStack_340 = &local_330;
        if (outputSourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
          local_678[0] = local_668;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_678,local_438,
                     outputSourceMapFilename._M_dataplus._M_p + (long)local_438);
          std::__cxx11::string::_M_assign((string *)(auStack_348 + 8));
          if (local_678[0] != local_668) {
            operator_delete(local_678[0],local_668[0] + 1);
          }
          local_658[0] = local_648;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_658,outputSourceMapFilename.field_2._8_8_,
                     outputSourceMapUrl._M_dataplus._M_p + outputSourceMapFilename.field_2._8_8_);
          std::__cxx11::string::_M_assign(local_320);
          if (local_658[0] != local_648) {
            operator_delete(local_658[0],local_648[0] + 1);
          }
        }
        local_98 = (undefined1  [8])&kindModuleExportMaps._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"output","");
        pmVar36 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&options.super_Options,(key_type *)local_98);
        pcVar3 = (pmVar36->_M_dataplus)._M_p;
        local_638[0] = local_628;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_638,pcVar3,pcVar3 + pmVar36->_M_string_length);
        wasm::ModuleWriter::write(local_378,&(anonymous_namespace)::merged,local_638);
        if (local_638[0] != local_628) {
          operator_delete(local_638[0],local_628[0] + 1);
        }
        if (local_98 != (undefined1  [8])&kindModuleExportMaps._M_h._M_bucket_count) {
          operator_delete((void *)local_98,kindModuleExportMaps._M_h._M_bucket_count + 1);
        }
        if ((undefined1 *)CONCAT71(local_320._1_7_,local_320[0]) != local_310) {
          operator_delete((undefined1 *)CONCAT71(local_320._1_7_,local_320[0]),
                          CONCAT71(local_310._1_7_,local_310[0]) + 1);
        }
        if (puStack_340 != &local_330) {
          operator_delete(puStack_340,
                          CONCAT44(local_330._M_t.
                                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                   .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._4_4_,
                                   (uint)local_330._M_t.
                                         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                         .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)
                          + 1);
        }
        if ((undefined1 *)local_368._8_8_ != &uStack_350) {
          operator_delete((void *)local_368._8_8_,CONCAT71(uStack_34f,uStack_350) + 1);
        }
      }
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_9b8);
      if (local_1b0 != &WasmMergeOption._M_string_length) {
        operator_delete(local_1b0,WasmMergeOption._M_string_length + 1);
      }
      if ((size_type *)outputSourceMapFilename.field_2._8_8_ != &outputSourceMapUrl._M_string_length
         ) {
        operator_delete((void *)outputSourceMapFilename.field_2._8_8_,
                        CONCAT71(outputSourceMapUrl._M_string_length._1_7_,
                                 (undefined1)outputSourceMapUrl._M_string_length) + 1);
      }
      if (local_438 != &outputSourceMapFilename._M_string_length) {
        operator_delete(local_438,
                        CONCAT71(outputSourceMapFilename._M_string_length._1_7_,
                                 (undefined1)outputSourceMapFilename._M_string_length) + 1);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&options.enabledFeatures);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_398);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_1e8);
      return 0;
    }
    wasm::Fatal::Fatal((Fatal *)local_378);
    wasm::Fatal::operator<<((Fatal *)local_378,(char (*) [25])"import/export mismatches");
  }
  else {
    wasm::Fatal::Fatal((Fatal *)local_378);
    wasm::Fatal::operator<<
              ((Fatal *)local_378,
               (char (*) [161])
               "Please provide an import name for each input file. In particular, the number of positional inputs must be even as each wasm binary must be followed by its name."
              );
  }
LAB_0010dd58:
  wasm::Fatal::~Fatal((Fatal *)local_378);
}

Assistant:

int main(int argc, const char* argv[]) {
  std::vector<std::string> inputFiles;
  std::vector<std::string> inputFileNames;
  bool emitBinary = true;
  bool debugInfo = false;
  std::map<size_t, std::string> inputSourceMapFilenames;
  std::string outputSourceMapFilename;
  std::string outputSourceMapUrl;

  const std::string WasmMergeOption = "wasm-merge options";

  ToolOptions options("wasm-merge",
                      R"(Merge wasm files into one.

For example,

  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm

will read foo.wasm and bar.wasm, with names 'foo' and 'bar' respectively, so if the second imports from 'foo', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.

Note that filenames and modules names are interleaved (which is hopefully less confusing).

Input source maps can be specified by adding an -ism option right after the module name:

  wasm-merge foo.wasm foo -ism foo.wasm.map ...)");

  options
    .add("--output",
         "-o",
         "Output file",
         WasmMergeOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add_positional("INFILE1 NAME1 INFILE2 NAME2 [..]",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      if (inputFiles.size() == inputFileNames.size()) {
                        inputFiles.push_back(argument);
                      } else {
                        inputFileNames.push_back(argument);
                      }
                    })
    .add("--input-source-map",
         "-ism",
         "Consume source maps from the specified files",
         WasmMergeOption,
         Options::Arguments::N,
         [&](Options* o, const std::string& argument) {
           size_t pos = inputFiles.size();
           if (pos == 0 || pos != inputFileNames.size() ||
               inputSourceMapFilenames.count(pos - 1)) {
             std::cerr << "Option '-ism " << argument
                       << "' should be right after the module name\n";
             exit(EXIT_FAILURE);
           }
           inputSourceMapFilenames.insert({pos - 1, argument});
         })
    .add("--output-source-map",
         "-osm",
         "Emit source map to the specified file",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapFilename](Options* o, const std::string& argument) {
           outputSourceMapFilename = argument;
         })
    .add("--output-source-map-url",
         "-osu",
         "Emit specified string as source map URL",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapUrl](Options* o, const std::string& argument) {
           outputSourceMapUrl = argument;
         })
    .add("--rename-export-conflicts",
         "-rec",
         "Rename exports to avoid conflicts (rather than error)",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = RenameExportConflicts;
         })
    .add("--skip-export-conflicts",
         "-sec",
         "Skip exports that conflict with previous ones",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = SkipExportConflicts;
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; });
  options.parse(argc, argv);

  if (inputFiles.size() != inputFileNames.size()) {
    Fatal() << "Please provide an import name for each input file. "
               "In particular, the number of positional inputs must be even as "
               "each wasm binary must be followed by its name.";
  }

  // Process the inputs.
  // TODO: If the inputs are a very large number of small modules then it might
  //       make sense to parallelize this. (If so, then changing the existing
  //       parallelism above in NameMapper might make sense.)

  for (Index i = 0; i < inputFiles.size(); i++) {
    auto inputFile = inputFiles[i];
    auto inputFileName = inputFileNames[i];
    auto iter = inputSourceMapFilenames.find(i);
    auto inputSourceMapFilename =
      (iter == inputSourceMapFilenames.end()) ? "" : iter->second;

    if (options.debug) {
      std::cerr << "reading input '" << inputFile << "' as '" << inputFileName
                << "'...\n";
    }

    // For the first input, we'll just read it in directly. For later inputs,
    // we read them and then merge.
    std::unique_ptr<Module> laterInput;
    Module* currModule;
    if (i == 0) {
      currModule = &merged;
    } else {
      laterInput = std::make_unique<Module>();
      currModule = laterInput.get();
    }

    options.applyOptionsBeforeParse(*currModule);

    ModuleReader reader;
    try {
      reader.read(inputFile, *currModule, inputSourceMapFilename);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      Fatal() << "error in parsing wasm input: " << inputFile;
    }

    options.applyOptionsAfterParse(*currModule);

    if (options.passOptions.validate) {
      if (!WasmValidator().validate(*currModule)) {
        std::cout << *currModule << '\n';
        Fatal() << "error in validating input: " << inputFile;
      }
    }

    if (!laterInput) {
      // This is the very first module, which we read directly into |merged|.
      // The only other operation we need to do is note the exports for later.
      for (auto& curr : merged.exports) {
        exportModuleMap[curr.get()] = ExportInfo{inputFileName, curr->name};
      }
    } else {
      // This is a later module: do a full merge.
      mergeInto(*currModule, inputFileName);

      if (options.passOptions.validate) {
        if (!WasmValidator().validate(merged)) {
          std::cout << merged << '\n';
          Fatal() << "error in validating merged after: " << inputFile;
        }
      }
    }
  }

  // Fuse imports and exports now that everything is all together in the merged
  // module.
  fuseImportsAndExports();

  {
    PassRunner passRunner(&merged);
    // We might have made some globals read from others that now appear after
    // them (if the one they read was appended from a later module). Sort them
    // to fix that. TODO: we could do this only if we actually append globals
    passRunner.add("reorder-globals-always");
    // Remove unused things. This is obviously a useful optimization but it also
    // makes using the output easier: if an import was resolved by an export
    // during the merge, then that import will have no more uses and it will be
    // optimized out (while if we didn't optimize it out then instantiating the
    // module would still be forced to provide something for that import).
    passRunner.add("remove-unused-module-elements");
    passRunner.run();
  }

  // Output.
  if (options.extra.count("output") > 0) {
    ModuleWriter writer(options.passOptions);
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    if (outputSourceMapFilename.size()) {
      writer.setSourceMapFilename(outputSourceMapFilename);
      writer.setSourceMapUrl(outputSourceMapUrl);
    }
    writer.write(merged, options.extra["output"]);
  }
}